

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall wasm::RemoveUnusedBrs::optimizeSwitch(RemoveUnusedBrs *this,Switch *curr)

{
  ArenaVector<wasm::Name> *this_00;
  int iVar1;
  ulong uVar2;
  Expression *pEVar3;
  char *pcVar4;
  Index index;
  Name *pNVar5;
  Name *pNVar6;
  Const *pCVar7;
  Binary *pBVar8;
  Drop *left;
  Break *pBVar9;
  Block *expression;
  ulong uVar10;
  LocalGet *left_00;
  Break *pBVar11;
  If *ifTrue;
  Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *this_01;
  uint x;
  uint uVar12;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  optional<wasm::Type> type_02;
  Builder local_40;
  Builder builder;
  
  this_00 = &curr->targets;
  builder.wasm = (Module *)this;
  while (((curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements !=
          0 && (pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::back
                                   (&this_00->
                                     super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
               (pNVar5->super_IString).str._M_str == (curr->default_).super_IString.str._M_str))) {
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::pop_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
  }
  x = 0;
  while ((uVar10 = (ulong)x,
         uVar10 < (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                  usedElements &&
         (pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                             (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                              uVar10),
         (pNVar5->super_IString).str._M_str == (curr->default_).super_IString.str._M_str))) {
    x = x + 1;
  }
  if (uVar10 != 0) {
    uVar12 = 0;
    while( true ) {
      uVar2 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements;
      if (uVar2 <= x + uVar12) break;
      pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)(x + uVar12));
      pNVar6 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)uVar12);
      pcVar4 = (pNVar5->super_IString).str._M_str;
      (pNVar6->super_IString).str._M_len = (pNVar5->super_IString).str._M_len;
      (pNVar6->super_IString).str._M_str = pcVar4;
      uVar12 = uVar12 + 1;
    }
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,uVar2 - uVar10);
    local_40.wasm = (Module *)((builder.wasm)->debugInfoSourceRoot)._M_string_length;
    pEVar3 = curr->condition;
    pCVar7 = Builder::makeConst<int>(&local_40,x);
    pBVar8 = Builder::makeBinary(&local_40,SubInt32,pEVar3,(Expression *)pCVar7);
    curr->condition = (Expression *)pBVar8;
  }
  if (curr->value == (Expression *)0x0) {
    uVar10 = (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
    ;
    if (uVar10 == 1) {
      local_40.wasm = (Module *)((builder.wasm)->debugInfoSourceRoot)._M_string_length;
      this_01 = (Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                &((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pEVar3 = curr->condition;
      pBVar9 = Builder::makeBreak(&local_40,(Name)(curr->default_).super_IString.str,
                                  (Expression *)0x0,(Expression *)0x0);
      pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::front
                         (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
      uVar10 = 0;
      pBVar11 = Builder::makeBreak(&local_40,(Name)(pNVar5->super_IString).str,(Expression *)0x0,
                                   (Expression *)0x0);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      expression = (Block *)Builder::makeIf(&local_40,pEVar3,(Expression *)pBVar9,
                                            (Expression *)pBVar11,type_00);
    }
    else if (uVar10 == 0) {
      local_40.wasm = (Module *)((builder.wasm)->debugInfoSourceRoot)._M_string_length;
      this_01 = (Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                &((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      left = Builder::makeDrop(&local_40,curr->condition);
      uVar10 = 0;
      pBVar9 = Builder::makeBreak(&local_40,(Name)(curr->default_).super_IString.str,
                                  (Expression *)0x0,(Expression *)0x0);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      expression = Builder::makeSequence(&local_40,(Expression *)left,(Expression *)pBVar9,type);
    }
    else {
      iVar1 = *(int *)&((builder.wasm)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[7]._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if ((uVar10 < 0xd || iVar1 < 1) && (uVar10 < 0x80 || 0 < iVar1)) {
        return;
      }
      uVar10 = 1;
      while (uVar10 < (curr->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements - 1) {
        pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                            uVar10);
        uVar10 = (ulong)((int)uVar10 + 1);
        if ((pNVar5->super_IString).str._M_str != (curr->default_).super_IString.str._M_str) {
          return;
        }
      }
      this_01 = (Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                &((builder.wasm)->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_40.wasm = (Module *)((builder.wasm)->debugInfoSourceRoot)._M_string_length;
      index = Builder::addVar((Function *)((builder.wasm)->debugInfoSourceRoot)._M_dataplus._M_p,
                              (Type)0x2);
      builder.wasm = (Module *)Builder::makeLocalTee(&local_40,index,curr->condition,(Type)0x2);
      left_00 = MixedArena::alloc<wasm::LocalGet>(&(local_40.wasm)->allocator);
      left_00->index = index;
      (left_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = 2;
      pCVar7 = Builder::makeConst<int>
                         (&local_40,
                          (int)(curr->targets).
                               super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                               usedElements + -1);
      pBVar8 = Builder::makeBinary(&local_40,EqInt32,(Expression *)left_00,(Expression *)pCVar7);
      pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::back
                         (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
      pBVar9 = Builder::makeBreak(&local_40,(Name)(pNVar5->super_IString).str,(Expression *)0x0,
                                  (Expression *)0x0);
      uVar10 = 0;
      pBVar11 = Builder::makeBreak(&local_40,(Name)(curr->default_).super_IString.str,
                                   (Expression *)0x0,(Expression *)0x0);
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      ifTrue = Builder::makeIf(&local_40,(Expression *)pBVar8,(Expression *)pBVar9,
                               (Expression *)pBVar11,type_01);
      pNVar5 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::front
                         (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
      uVar10 = 0;
      pBVar9 = Builder::makeBreak(&local_40,(Name)(pNVar5->super_IString).str,(Expression *)0x0,
                                  (Expression *)0x0);
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      expression = (Block *)Builder::makeIf(&local_40,(Expression *)builder.wasm,
                                            (Expression *)ifTrue,(Expression *)pBVar9,type_02);
    }
    Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
              (this_01,(Expression *)expression);
  }
  return;
}

Assistant:

void optimizeSwitch(Switch* curr) {
    // if the final element is the default, we don't need it
    while (!curr->targets.empty() && curr->targets.back() == curr->default_) {
      curr->targets.pop_back();
    }
    // if the first element is the default, we can remove it by shifting
    // everything (which does add a subtraction of a constant, but often that is
    // worth it as the constant can be folded away and/or we remove multiple
    // elements here)
    Index removable = 0;
    while (removable < curr->targets.size() &&
           curr->targets[removable] == curr->default_) {
      removable++;
    }
    if (removable > 0) {
      for (Index i = removable; i < curr->targets.size(); i++) {
        curr->targets[i - removable] = curr->targets[i];
      }
      curr->targets.resize(curr->targets.size() - removable);
      Builder builder(*getModule());
      curr->condition = builder.makeBinary(
        SubInt32, curr->condition, builder.makeConst(int32_t(removable)));
    }
    // when there isn't a value, we can do some trivial optimizations without
    // worrying about the value being executed before the condition
    if (curr->value) {
      return;
    }
    if (curr->targets.size() == 0) {
      // a switch with just a default always goes there
      Builder builder(*getModule());
      replaceCurrent(builder.makeSequence(builder.makeDrop(curr->condition),
                                          builder.makeBreak(curr->default_)));
    } else if (curr->targets.size() == 1) {
      // a switch with two options is basically an if
      Builder builder(*getModule());
      replaceCurrent(builder.makeIf(curr->condition,
                                    builder.makeBreak(curr->default_),
                                    builder.makeBreak(curr->targets.front())));
    } else {
      // there are also some other cases where we want to convert a switch into
      // ifs, especially if the switch is large and we are focusing on size. an
      // especially egregious case is a switch like this: [a b b [..] b b c]
      // with default b (which may be arrived at after we trim away excess
      // default values on both sides). in this case, we really have 3 values in
      // a simple form, so it is the next logical case after handling 1 and 2
      // values right above here. to optimize this, we must add a local + a
      // bunch of nodes (if*2, tee, eq, get, const, break*3), so the table must
      // be big enough for it to make sense

      // How many targets we need when shrinking. This is literally the size at
      // which the transformation begins to be smaller.
      const uint32_t MIN_SHRINK = 13;
      // How many targets we need when not shrinking, in which case, 2 ifs may
      // be slower, so we do this when the table is ridiculously large for one
      // with just 3 values in it.
      const uint32_t MIN_GENERAL = 128;

      auto shrink = getPassRunner()->options.shrinkLevel > 0;
      if ((curr->targets.size() >= MIN_SHRINK && shrink) ||
          (curr->targets.size() >= MIN_GENERAL && !shrink)) {
        for (Index i = 1; i < curr->targets.size() - 1; i++) {
          if (curr->targets[i] != curr->default_) {
            return;
          }
        }
        // great, we are in that case, optimize
        Builder builder(*getModule());
        auto temp = builder.addVar(getFunction(), Type::i32);
        Expression* z;
        replaceCurrent(z = builder.makeIf(
                         builder.makeLocalTee(temp, curr->condition, Type::i32),
                         builder.makeIf(builder.makeBinary(
                                          EqInt32,
                                          builder.makeLocalGet(temp, Type::i32),
                                          builder.makeConst(
                                            int32_t(curr->targets.size() - 1))),
                                        builder.makeBreak(curr->targets.back()),
                                        builder.makeBreak(curr->default_)),
                         builder.makeBreak(curr->targets.front())));
      }
    }
  }